

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodySharedMass.cpp
# Opt level: O2

void __thiscall
chrono::ChVariablesBodySharedMass::DiagonalAdd
          (ChVariablesBodySharedMass *this,ChVectorRef *result,double c_a)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Scalar *pSVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  dVar1 = this->sharedmass->mass;
  pSVar8 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)result,(long)(this->super_ChVariablesBody).super_ChVariables.offset);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = c_a;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *pSVar8;
  auVar2 = vfmadd213sd_fma(auVar15,auVar9,auVar2);
  *pSVar8 = auVar2._0_8_;
  dVar1 = this->sharedmass->mass;
  pSVar8 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)result,(long)(this->super_ChVariablesBody).super_ChVariables.offset + 1);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = c_a;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar1;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *pSVar8;
  auVar2 = vfmadd213sd_fma(auVar16,auVar10,auVar3);
  *pSVar8 = auVar2._0_8_;
  dVar1 = this->sharedmass->mass;
  pSVar8 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)result,(long)(this->super_ChVariablesBody).super_ChVariables.offset + 2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = c_a;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar1;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *pSVar8;
  auVar2 = vfmadd213sd_fma(auVar17,auVar11,auVar4);
  *pSVar8 = auVar2._0_8_;
  dVar1 = (this->sharedmass->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  pSVar8 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)result,(long)(this->super_ChVariablesBody).super_ChVariables.offset + 3);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = c_a;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar1;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *pSVar8;
  auVar2 = vfmadd213sd_fma(auVar18,auVar12,auVar5);
  *pSVar8 = auVar2._0_8_;
  dVar1 = (this->sharedmass->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  pSVar8 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)result,(long)(this->super_ChVariablesBody).super_ChVariables.offset + 4);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = c_a;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *pSVar8;
  auVar2 = vfmadd213sd_fma(auVar19,auVar13,auVar6);
  *pSVar8 = auVar2._0_8_;
  dVar1 = (this->sharedmass->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  pSVar8 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)result,(long)(this->super_ChVariablesBody).super_ChVariables.offset + 5);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = c_a;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *pSVar8;
  auVar2 = vfmadd213sd_fma(auVar20,auVar14,auVar7);
  *pSVar8 = auVar2._0_8_;
  return;
}

Assistant:

void ChVariablesBodySharedMass::DiagonalAdd(ChVectorRef result, const double c_a) const {
    result(this->offset + 0) += c_a * sharedmass->mass;
    result(this->offset + 1) += c_a * sharedmass->mass;
    result(this->offset + 2) += c_a * sharedmass->mass;
    result(this->offset + 3) += c_a * sharedmass->inertia(0, 0);
    result(this->offset + 4) += c_a * sharedmass->inertia(1, 1);
    result(this->offset + 5) += c_a * sharedmass->inertia(2, 2);
}